

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

double __thiscall mat<3UL,_3UL>::cofactor(mat<3UL,_3UL> *this,size_t row,size_t col)

{
  double dVar1;
  mat<2UL,_2UL> mStack_38;
  
  get_minor(&mStack_38,this,row,col);
  dVar1 = dt<2UL>::det(&mStack_38);
  if (((int)col + (int)row & 1U) != 0) {
    dVar1 = -dVar1;
  }
  return dVar1;
}

Assistant:

double cofactor(const size_t row, const size_t col) const
    {
        return get_minor(row, col).det() * ((row + col) % 2 ? -1 : 1);
    }